

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_detail.c
# Opt level: O0

int main(void)

{
  test();
  return 0;
}

Assistant:

int main()
{
	test();

	return 0;
}